

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

ErrorData * __thiscall
duckdb::ART::Insert(ErrorData *__return_storage_ptr__,ART *this,IndexLock *l,DataChunk *chunk,
                   Vector *row_ids,IndexAppendInfo *info)

{
  size_type __n;
  ARTConflictType AVar1;
  Allocator *allocator_00;
  DataChunk *pDVar2;
  optional_ptr<duckdb::ART,_true> index;
  ErrorData *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  idx_t iVar3;
  idx_t i;
  ulong uVar4;
  long lVar5;
  allocator local_161;
  ErrorData *local_160;
  TransactionException local_158;
  optional_idx conflict_idx;
  optional_ptr<duckdb::ART,_true> local_138;
  string msg;
  string local_108;
  unsafe_vector<ARTKey> row_id_keys;
  unsafe_vector<ARTKey> keys;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ArenaAllocator allocator;
  
  __n = chunk->count;
  allocator_00 = BufferAllocator::Get((this->super_BoundIndex).super_Index.db);
  ArenaAllocator::ArenaAllocator(&allocator,allocator_00,0x800);
  ::std::vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>::vector
            (&keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>,__n,
             (allocator_type *)&msg);
  ::std::vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>::vector
            (&row_id_keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>,__n,
             (allocator_type *)&msg);
  GenerateKeyVectors(this,&allocator,chunk,row_ids,&keys,&row_id_keys);
  local_160 = __return_storage_ptr__;
  if ((info->delete_index).ptr == (BoundIndex *)0x0) {
    local_138.ptr = (ART *)0x0;
  }
  else {
    local_138.ptr = (ART *)optional_ptr<duckdb::BoundIndex,_true>::operator->(&info->delete_index);
  }
  conflict_idx.index = 0xffffffffffffffff;
  lVar5 = 0;
  iVar3 = 0;
  do {
    if (__n == iVar3) goto LAB_019397b0;
    if (*(long *)((long)&(keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                          super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                          _M_impl.super__Vector_impl_data._M_start)->len + lVar5) != 0) {
      index.ptr = local_138.ptr;
      AVar1 = Insert(this,&this->tree,
                     (ARTKey *)
                     ((long)&(keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar5),0,
                     (ARTKey *)
                     ((long)&(row_id_keys.
                              super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                              _M_impl.super__Vector_impl_data._M_start)->len + lVar5),
                     (GateStatus)((this->tree).super_IndexPointer.data >> 0x3f),local_138,
                     info->append_mode);
      if (AVar1 != NO_CONFLICT) {
        optional_idx::optional_idx((optional_idx *)&msg,iVar3);
        conflict_idx.index = (idx_t)msg._M_dataplus._M_p;
        lVar5 = 0;
        uVar4 = 0;
        while( true ) {
          iVar3 = optional_idx::GetIndex(&conflict_idx);
          if (iVar3 <= uVar4) break;
          if (*(long *)((long)&(keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                                _M_impl.super__Vector_impl_data._M_start)->len + lVar5) != 0) {
            index.ptr = (ART *)0x0;
            Erase(this,&this->tree,
                  (ARTKey *)
                  ((long)&(keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                           super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                           _M_impl.super__Vector_impl_data._M_start)->len + lVar5),0,
                  (ARTKey *)
                  ((long)&(row_id_keys.super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>
                           .super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                           _M_impl.super__Vector_impl_data._M_start)->len + lVar5),
                  (GateStatus)((this->tree).super_IndexPointer.data >> 0x3f));
          }
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 0x10;
        }
        if (AVar1 == CONSTRAINT) {
          pDVar2 = (DataChunk *)optional_idx::GetIndex(&conflict_idx);
          BoundIndex::AppendRowError_abi_cxx11_(&msg,(BoundIndex *)chunk,pDVar2,(idx_t)index.ptr);
          ::std::__cxx11::string::string
                    ((string *)&local_108,
                     "PRIMARY KEY or UNIQUE constraint violation: duplicate key \"%s\"",&local_161);
          ::std::__cxx11::string::string((string *)&local_b8,(string *)&msg);
          this_00 = local_160;
          ConstraintException::ConstraintException<std::__cxx11::string>
                    ((ConstraintException *)&local_158,&local_108,&local_b8);
          ErrorData::ErrorData(this_00,(exception *)&local_158);
          ::std::runtime_error::~runtime_error((runtime_error *)&local_158);
          this_01 = &local_b8;
        }
        else {
          if (AVar1 != TRANSACTION) {
LAB_019397b0:
            this_00 = local_160;
            ErrorData::ErrorData(local_160);
            goto LAB_0193985a;
          }
          pDVar2 = (DataChunk *)optional_idx::GetIndex(&conflict_idx);
          BoundIndex::AppendRowError_abi_cxx11_(&msg,(BoundIndex *)chunk,pDVar2,(idx_t)index.ptr);
          ::std::__cxx11::string::string
                    ((string *)&local_108,"write-write conflict on key: \"%s\"",&local_161);
          ::std::__cxx11::string::string((string *)&local_98,(string *)&msg);
          this_00 = local_160;
          TransactionException::TransactionException<std::__cxx11::string>
                    (&local_158,&local_108,&local_98);
          ErrorData::ErrorData(this_00,(exception *)&local_158);
          ::std::runtime_error::~runtime_error((runtime_error *)&local_158);
          this_01 = &local_98;
        }
        ::std::__cxx11::string::~string((string *)this_01);
        ::std::__cxx11::string::~string((string *)&local_108);
        ::std::__cxx11::string::~string((string *)&msg);
LAB_0193985a:
        ::std::_Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>::~_Vector_base
                  ((_Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_> *)&row_id_keys);
        ::std::_Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>::~_Vector_base
                  ((_Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_> *)&keys);
        ArenaAllocator::~ArenaAllocator(&allocator);
        return this_00;
      }
    }
    iVar3 = iVar3 + 1;
    lVar5 = lVar5 + 0x10;
  } while( true );
}

Assistant:

ErrorData ART::Insert(IndexLock &l, DataChunk &chunk, Vector &row_ids, IndexAppendInfo &info) {
	D_ASSERT(row_ids.GetType().InternalType() == ROW_TYPE);
	auto row_count = chunk.size();

	ArenaAllocator allocator(BufferAllocator::Get(db));
	unsafe_vector<ARTKey> keys(row_count);
	unsafe_vector<ARTKey> row_id_keys(row_count);
	GenerateKeyVectors(allocator, chunk, row_ids, keys, row_id_keys);

	optional_ptr<ART> delete_art;
	if (info.delete_index) {
		delete_art = info.delete_index->Cast<ART>();
	}

	auto conflict_type = ARTConflictType::NO_CONFLICT;
	optional_idx conflict_idx;
	auto was_empty = !tree.HasMetadata();

	// Insert the entries into the index.
	for (idx_t i = 0; i < row_count; i++) {
		if (keys[i].Empty()) {
			continue;
		}
		conflict_type = Insert(tree, keys[i], 0, row_id_keys[i], tree.GetGateStatus(), delete_art, info.append_mode);
		if (conflict_type != ARTConflictType::NO_CONFLICT) {
			conflict_idx = i;
			break;
		}
	}

	// Remove any previously inserted entries.
	if (conflict_type != ARTConflictType::NO_CONFLICT) {
		D_ASSERT(conflict_idx.IsValid());
		for (idx_t i = 0; i < conflict_idx.GetIndex(); i++) {
			if (keys[i].Empty()) {
				continue;
			}
			Erase(tree, keys[i], 0, row_id_keys[i], tree.GetGateStatus());
		}
	}

	if (was_empty) {
		// All nodes are in-memory.
		VerifyAllocationsInternal();
	}

	if (conflict_type == ARTConflictType::TRANSACTION) {
		auto msg = AppendRowError(chunk, conflict_idx.GetIndex());
		return ErrorData(TransactionException("write-write conflict on key: \"%s\"", msg));
	}

	if (conflict_type == ARTConflictType::CONSTRAINT) {
		auto msg = AppendRowError(chunk, conflict_idx.GetIndex());
		return ErrorData(ConstraintException("PRIMARY KEY or UNIQUE constraint violation: duplicate key \"%s\"", msg));
	}

#ifdef DEBUG
	for (idx_t i = 0; i < row_count; i++) {
		if (keys[i].Empty()) {
			continue;
		}
		D_ASSERT(Lookup(tree, keys[i], 0));
	}
#endif
	return ErrorData();
}